

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * extended_gcd(BigInt *__return_storage_ptr__,BigInt *a,BigInt *b,BigInt *x,BigInt *y)

{
  BigInt *a_00;
  bool bVar1;
  BigInt local_c0;
  BigInt local_a0;
  BigInt local_80;
  undefined1 local_5d;
  BigInt local_50;
  BigInt *local_30;
  BigInt *y_local;
  BigInt *x_local;
  BigInt *b_local;
  BigInt *a_local;
  BigInt *g;
  
  local_30 = y;
  y_local = x;
  x_local = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  BigInt::BigInt(&local_50,0);
  bVar1 = BigInt::operator==(b,&local_50);
  BigInt::~BigInt(&local_50);
  a_00 = x_local;
  if (bVar1) {
    BigInt::operator=(y_local,1);
    BigInt::operator=(local_30,0);
    BigInt::BigInt(__return_storage_ptr__,b_local);
  }
  else {
    local_5d = 0;
    BigInt::operator%(&local_80,b_local,x_local);
    extended_gcd(__return_storage_ptr__,a_00,&local_80,local_30,y_local);
    BigInt::~BigInt(&local_80);
    BigInt::operator/(&local_c0,b_local,x_local);
    BigInt::operator*(&local_a0,&local_c0,y_local);
    BigInt::operator-=(local_30,&local_a0);
    BigInt::~BigInt(&local_a0);
    BigInt::~BigInt(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt extended_gcd(const BigInt &a, const BigInt &b, BigInt &x, BigInt &y) {
    if (b == BigInt(0)) //!check on b for the zero division
    {
        x = 1, y = 0; //! a*1 + b *0 = gcd(a,0) =  a
        return a;
    }

    BigInt g = extended_gcd(b, a % b, y, x); //! b, a % b order for infinite loops
    y -= (a / b) * x;//!Ynew= Xold - (a/b) * Yold , Xnew=Yold
    return g;
}